

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O2

bool __thiscall SGParser::Generator::Production::RHSEquals(Production *this,Production *right)

{
  uint *puVar1;
  bool bVar2;
  uint *in_RCX;
  
  puVar1 = this->pRight;
  if (puVar1 == right->pRight) {
    bVar2 = true;
  }
  else if (this->Length == right->Length) {
    bVar2 = std::__equal<true>::equal<unsigned_int>
                      ((__equal<true> *)(puVar1 + 1),puVar1 + (ulong)this->Length + 1,
                       right->pRight + 1,in_RCX);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Production::RHSEquals(const Production& right) const noexcept {
    if (pRight == right.pRight)
        return true;
    else if (Length != right.Length)
        return false;
    return std::equal(pRight + 1u, pRight + 1u + Length, right.pRight + 1u);
}